

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_trace_file_base.cpp
# Opt level: O0

void __thiscall
sc_core::sc_trace_file_base::timestamp_in_trace_units
          (sc_trace_file_base *this,unit_type *high,unit_type *low)

{
  bool bVar1;
  sc_time *this_00;
  value_type vVar2;
  uint64 uVar3;
  ulong uVar4;
  ulong *in_RDX;
  value_type *in_RSI;
  sc_trace_file_base *in_RDI;
  unit_type unit_divisor;
  unit_type max_low_units;
  unit_type delta_now;
  unit_type time_now;
  
  this_00 = sc_time_stamp();
  vVar2 = sc_time::value(this_00);
  uVar3 = sc_delta_count_at_current_time();
  bVar1 = has_low_units(in_RDI);
  if (bVar1) {
    uVar4 = in_RDI->kernel_unit_fs / in_RDI->trace_unit_fs;
    *in_RDX = 0;
    *in_RSI = vVar2;
    bVar1 = delta_cycles(in_RDI);
    if (bVar1) {
      *in_RDX = uVar3 % uVar4 + *in_RDX;
      *in_RSI = uVar3 / uVar4 + *in_RSI;
    }
  }
  else {
    uVar4 = in_RDI->trace_unit_fs / in_RDI->kernel_unit_fs;
    *in_RDX = vVar2 % uVar4;
    *in_RSI = vVar2 / uVar4;
    bVar1 = delta_cycles(in_RDI);
    if (bVar1) {
      *in_RSI = uVar3 + *in_RSI;
    }
  }
  return;
}

Assistant:

void
sc_trace_file_base::timestamp_in_trace_units(unit_type &high, unit_type &low) const
{
    unit_type time_now = sc_time_stamp().value();
    unit_type delta_now = sc_delta_count_at_current_time();

    if (has_low_units()) {
        unit_type max_low_units = kernel_unit_fs / trace_unit_fs;
        low = 0;
        high = time_now;

        if (delta_cycles()) {
            low += delta_now % max_low_units;
            high += delta_now / max_low_units;
        }

    } else {
        unit_type unit_divisor = trace_unit_fs / kernel_unit_fs;
        low = time_now % unit_divisor;
        high = time_now / unit_divisor;

        if (delta_cycles())
            high += delta_now;
    }
}